

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::CopyInputEdges(S2Builder *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference b;
  reference pvVar4;
  BasicVector<Vector3,_double,_3UL> *this_00;
  reference ppVar5;
  bool local_b9;
  InputEdge *e;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  S2Point *site;
  int in;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> vmap;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> sorted;
  S2Builder *this_local;
  
  SortInputVertices((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *)
                    &vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,this);
  sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                    (&this->input_vertices_);
  std::allocator<int>::allocator(&local_41);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,sVar2,&local_41);
  std::allocator<int>::~allocator(&local_41);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear(&this->sites_);
  sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                    (&this->input_vertices_);
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve(&this->sites_,sVar2);
  site._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::size
                      ((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                        *)&vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= (ulong)(long)(int)site) break;
    pvVar3 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
             operator[]((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                         *)&vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(int)site);
    b = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (&this->input_vertices_,(long)pvVar3->second);
    sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(&this->sites_);
    pvVar3 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
             operator[]((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                         *)&vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(int)site);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)pvVar3->second);
    *pvVar4 = (value_type)sVar2;
    while( true ) {
      site._0_4_ = (int)site + 1;
      sVar2 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
              size((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *)
                   &vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      local_b9 = false;
      if ((ulong)(long)(int)site < sVar2) {
        pvVar3 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
                 operator[]((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                             *)&vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)(int)site);
        this_00 = (BasicVector<Vector3,_double,_3UL> *)
                  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                            (&this->input_vertices_,(long)pvVar3->second);
        local_b9 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                             (this_00,b);
      }
      if (local_b9 == false) break;
      sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(&this->sites_);
      pvVar3 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::
               operator[]((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                           *)&vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)(int)site);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)pvVar3->second);
      *pvVar4 = (value_type)sVar2;
    }
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(&this->sites_,b);
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator=
            (&this->input_vertices_,&this->sites_);
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     (&this->input_edges_);
  e = (InputEdge *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                (&this->input_edges_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&e);
    if (!bVar1) break;
    ppVar5 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end1);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)ppVar5->first);
    ppVar5->first = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,(long)ppVar5->second);
    ppVar5->second = *pvVar4;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::~vector
            ((vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *)
             &vmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void S2Builder::CopyInputEdges() {
  // Sort the input vertices, discard duplicates, and update the input edges
  // to refer to the pruned vertex list.  (We sort in the same order used by
  // ChooseInitialSites() to avoid inconsistencies in tests.)
  vector<InputVertexKey> sorted = SortInputVertices();
  vector<InputVertexId> vmap(input_vertices_.size());
  sites_.clear();
  sites_.reserve(input_vertices_.size());
  for (int in = 0; in < sorted.size(); ) {
    const S2Point& site = input_vertices_[sorted[in].second];
    vmap[sorted[in].second] = sites_.size();
    while (++in < sorted.size() && input_vertices_[sorted[in].second] == site) {
      vmap[sorted[in].second] = sites_.size();
    }
    sites_.push_back(site);
  }
  input_vertices_ = sites_;
  for (InputEdge& e : input_edges_) {
    e.first = vmap[e.first];
    e.second = vmap[e.second];
  }
}